

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O0

int base64toValue(char base64character,uchar *value)

{
  undefined4 local_1c;
  int result;
  uchar *value_local;
  char base64character_local;
  
  local_1c = 0;
  if ((base64character < 'A') || ('Z' < base64character)) {
    if ((base64character < 'a') || ('z' < base64character)) {
      if ((base64character < '0') || ('9' < base64character)) {
        if (base64character == '+') {
          *value = '>';
        }
        else if (base64character == '/') {
          *value = '?';
        }
        else {
          *value = '\0';
          local_1c = -1;
        }
      }
      else {
        *value = base64character + '\x04';
      }
    }
    else {
      *value = base64character + 0xb9;
    }
  }
  else {
    *value = base64character + 0xbf;
  }
  return local_1c;
}

Assistant:

static int base64toValue(char base64character, unsigned char* value)
{
    int result = 0;
    if (('A' <= base64character) && (base64character <= 'Z'))
    {
        *value = base64character - 'A';
    }
    else if (('a' <= base64character) && (base64character <= 'z'))
    {
        *value = ('Z' - 'A') + 1 + (base64character - 'a');
    }
    else if (('0' <= base64character) && (base64character <= '9'))
    {
        *value = ('Z' - 'A') + 1 + ('z' - 'a') + 1 + (base64character - '0');
    }
    else if ('+' == base64character)
    {
        *value = 62;
    }
    else if ('/' == base64character)
    {
        *value = 63;
    }
    else
    {
        *value = 0;
        result = -1;
    }
    return result;
}